

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall
Executor::handleVariableCall
          (Executor *this,FunctionCallNode *node,RuntimeVariableAnalyser *variableAnalyser)

{
  shared_ptr<ExpressionNode> value;
  Executor executor;
  __shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> local_258;
  Executor local_248;
  
  std::__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_258,
             &(variableAnalyser->value_).
              super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>);
  Executor(&local_248,
           (Context *)
           (variableAnalyser->context_).
           super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
           super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
  (*((local_258._M_ptr)->super_Node)._vptr_Node[2])(local_258._M_ptr,&local_248);
  callValue(this,&node->super_CallNode,&node->name_,
            (Value *)local_248.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>
                     ._M_t.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                     super__Head_base<0UL,_Value_*,_false>._M_head_impl);
  ~Executor(&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  return;
}

Assistant:

void Executor::handleVariableCall(const FunctionCallNode& node, const RuntimeVariableAnalyser& variableAnalyser)
{
  const auto value = variableAnalyser.getValue();
  auto executor = Executor{variableAnalyser.getContext()};
  value->accept(executor);

  callValue(node, node.getName(), *executor.getValue());
}